

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O0

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  cmExecutionStatus *this_01;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  const_reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  long lVar7;
  char local_298 [8];
  char buffer [100];
  string local_228 [8];
  string coutput;
  size_type last;
  size_type first;
  string local_1d8;
  byte local_1b1;
  undefined1 local_1b0 [7];
  bool result;
  string output;
  int retVal;
  bool verbose;
  string local_168 [8];
  string command;
  string local_140;
  undefined4 local_120;
  allocator<char> local_119;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_d0 [7];
  bool havereturn_variable;
  string return_variable;
  undefined1 local_a8 [7];
  bool haveoutput_variable;
  string output_variable;
  int count;
  bool doingargs;
  string arguments;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExecProgramCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)&count);
    output_variable.field_2._M_local_buf[0xf] = '\0';
    output_variable.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_a8);
    return_variable.field_2._M_local_buf[0xf] = '\0';
    std::__cxx11::string::string((string *)local_d0);
    this_01 = param_2_local;
    bVar1 = false;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
    arg = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&arg), bVar2) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      bVar2 = std::operator==(local_f8,"OUTPUT_VARIABLE");
      if (bVar2) {
        output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
        output_variable.field_2._M_local_buf[0xf] = '\0';
        bVar1 = false;
        return_variable.field_2._M_local_buf[0xf] = '\x01';
      }
      else if ((return_variable.field_2._M_local_buf[0xf] & 1U) == 0) {
        bVar2 = std::operator==(local_f8,"RETURN_VALUE");
        if (bVar2) {
          output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
          output_variable.field_2._M_local_buf[0xf] = '\0';
          return_variable.field_2._M_local_buf[0xf] = '\0';
          bVar1 = true;
        }
        else if (bVar1) {
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,"called with incorrect number of arguments",
                       (allocator<char> *)(command.field_2._M_local_buf + 0xf));
            cmCommand::SetError(&this->super_cmCommand,&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(command.field_2._M_local_buf + 0xf));
            this_local._7_1_ = 0;
            local_120 = 1;
            goto LAB_0022c9a8;
          }
          std::__cxx11::string::operator=((string *)local_d0,(string *)local_f8);
          bVar1 = false;
          output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
        }
        else {
          bVar2 = std::operator==(local_f8,"ARGS");
          if (bVar2) {
            output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
            bVar1 = false;
            return_variable.field_2._M_local_buf[0xf] = '\0';
            output_variable.field_2._M_local_buf[0xf] = '\x01';
          }
          else if ((output_variable.field_2._M_local_buf[0xf] & 1U) != 0) {
            std::__cxx11::string::operator+=((string *)&count,(string *)local_f8);
            std::__cxx11::string::operator+=((string *)&count," ");
            output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
          }
        }
      }
      else {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_118,"called with incorrect number of arguments",&local_119);
          cmCommand::SetError(&this->super_cmCommand,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
          this_local._7_1_ = 0;
          local_120 = 1;
          goto LAB_0022c9a8;
        }
        std::__cxx11::string::operator=((string *)local_a8,(string *)local_f8);
        return_variable.field_2._M_local_buf[0xf] = '\0';
        output_variable.field_2._8_4_ = output_variable.field_2._8_4_ + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::string::string(local_168);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      cmSystemTools::ConvertToRunCommandPath((string *)&retVal,pvVar4);
      std::__cxx11::string::operator=(local_168,(string *)&retVal);
      std::__cxx11::string::~string((string *)&retVal);
      std::__cxx11::string::operator+=(local_168," ");
      std::__cxx11::string::operator+=(local_168,(string *)&count);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,0);
      std::__cxx11::string::operator=(local_168,(string *)pvVar4);
    }
    output.field_2._M_local_buf[0xf] = '\x01';
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      output.field_2._M_local_buf[0xf] = '\0';
    }
    output.field_2._8_4_ = 0;
    std::__cxx11::string::string((string *)local_1b0);
    local_1b1 = 1;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    if (sVar5 - (long)(int)output_variable.field_2._8_4_ == 2) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,1);
      cmsys::SystemTools::MakeDirectory(pvVar4,(mode_t *)0x0);
      std::__cxx11::string::string((string *)&local_1d8,local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,1);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_1b1 = RunCommand(&local_1d8,(string *)local_1b0,(int *)(output.field_2._M_local_buf + 8)
                             ,pcVar6,(bool)(output.field_2._M_local_buf[0xf] & 1),Auto);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      std::__cxx11::string::string((string *)&first,local_168);
      local_1b1 = RunCommand((string *)&first,(string *)local_1b0,
                             (int *)(output.field_2._M_local_buf + 8),(char *)0x0,
                             (bool)(output.field_2._M_local_buf[0xf] & 1),Auto);
      std::__cxx11::string::~string((string *)&first);
    }
    if ((local_1b1 & 1) == 0) {
      output.field_2._8_4_ = 0xffffffff;
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      last = std::__cxx11::string::find_first_not_of(local_1b0,0x80c844);
      coutput.field_2._8_8_ = std::__cxx11::string::find_last_not_of(local_1b0,0x80c844);
      if (last == 0xffffffffffffffff) {
        last = 0;
      }
      if (coutput.field_2._8_8_ == -1) {
        lVar7 = std::__cxx11::string::size();
        coutput.field_2._8_8_ = lVar7 + -1;
      }
      std::__cxx11::string::string
                (local_228,(string *)local_1b0,last,(coutput.field_2._8_8_ - last) + 1);
      this_00 = (this->super_cmCommand).Makefile;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddDefinition(this_00,(string *)local_a8,pcVar6);
      std::__cxx11::string::~string(local_228);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      sprintf(local_298,"%d",(ulong)(uint)output.field_2._8_4_);
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_d0,local_298);
    }
    this_local._7_1_ = 1;
    local_120 = 1;
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string(local_168);
LAB_0022c9a8:
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&count);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExecProgramCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmSystemTools::ConvertToRunCommandPath(args[0]);
    command += " ";
    command += arguments;
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = cmExecProgramCommand::RunCommand(command, output, retVal,
                                              args[1].c_str(), verbose);
  } else {
    result = cmExecProgramCommand::RunCommand(command, output, retVal, nullptr,
                                              verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
  }

  if (!return_variable.empty()) {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
  }

  return true;
}